

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>_>
          *other)

{
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  
  resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>const>>
            (this,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>_>
                   *)other);
  pMVar1 = DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
           lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>const>>
                     ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,other);
  return pMVar1;
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }